

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec2.c
# Opt level: O3

void ec2AddLD(word *c,word *a,word *b,ec_o *ec,void *stack)

{
  word *a_00;
  word *a_01;
  word *a_02;
  word *b_00;
  word *c_00;
  word *c_01;
  word *stack_00;
  word *b_01;
  word *b_02;
  size_t n;
  size_t n_00;
  bool_t bVar1;
  int iVar2;
  word *pwVar3;
  
  n = ec->f->n;
  a_00 = a + n + n;
  bVar1 = wwIsZero(a_00,n);
  pwVar3 = b;
  if (bVar1 == 0) {
    a_01 = b + n + n;
    bVar1 = wwIsZero(a_01,ec->f->n);
    pwVar3 = a;
    if (bVar1 == 0) {
      pwVar3 = (word *)((long)stack + n * 8);
      a_02 = pwVar3 + n;
      b_00 = a_02 + n;
      c_00 = b_00 + n;
      c_01 = c_00 + n;
      stack_00 = c_01 + n;
      (*ec->f->mul)((word *)stack,a,a_01,ec->f,stack_00);
      (*ec->f->mul)(pwVar3,b,a_00,ec->f,stack_00);
      (*ec->f->sqr)(a_02,a_01,ec->f,stack_00);
      (*ec->f->mul)(a_02,a_02,a + n,ec->f,stack_00);
      (*ec->f->sqr)(b_00,a_00,ec->f,stack_00);
      (*ec->f->mul)(b_00,b_00,b + n,ec->f,stack_00);
      iVar2 = wwCmp((word *)stack,pwVar3,ec->f->n);
      n_00 = ec->f->n;
      if (iVar2 != 0) {
        wwXor(c_00,(word *)stack,pwVar3,n_00);
        wwXor(c_01,a_02,b_00,ec->f->n);
        (*ec->f->mul)(c_00,c_00,c_01,ec->f,stack_00);
        (*ec->f->sqr)(c,(word *)stack,ec->f,stack_00);
        b_01 = c + n;
        (*ec->f->sqr)(b_01,pwVar3,ec->f,stack_00);
        wwXor(c_01,c,b_01,ec->f->n);
        b_02 = b_01 + n;
        (*ec->f->mul)(b_02,a_00,a_01,ec->f,stack_00);
        (*ec->f->mul)(b_02,c_01,b_02,ec->f,stack_00);
        wwXor2(b_00,b_01,ec->f->n);
        (*ec->f->mul)(b_00,(word *)stack,b_00,ec->f,stack_00);
        wwXor2(c,a_02,ec->f->n);
        (*ec->f->mul)(c,pwVar3,c,ec->f,stack_00);
        wwXor2(c,b_00,ec->f->n);
        (*ec->f->mul)((word *)stack,(word *)stack,c_00,ec->f,stack_00);
        (*ec->f->mul)(a_02,a_02,c_01,ec->f,stack_00);
        wwXor2((word *)stack,a_02,ec->f->n);
        (*ec->f->mul)((word *)stack,(word *)stack,c_01,ec->f,stack_00);
        wwXor(b_01,c_00,b_02,ec->f->n);
        (*ec->f->mul)(b_01,b_01,c,ec->f,stack_00);
        wwXor2(b_01,(word *)stack,ec->f->n);
        return;
      }
      iVar2 = wwCmp(a_02,b_00,n_00);
      if (iVar2 == 0) {
        ec2DblLD(c,a,ec,stack_00);
        return;
      }
      wwSetZero(c + n * 2,ec->f->n);
      return;
    }
  }
  wwCopy(c,pwVar3,n * 3);
  return;
}

Assistant:

static void ec2AddLD(word c[], const word a[], const word b[],
	const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n;
	word* t3 = t2 + n;
	word* t4 = t3 + n;
	word* t5 = t4 + n;
	word* t6 = t5 + n;
	stack = t6 + n;
	// pre
	ASSERT(ecIsOperable(ec) && ec->d == 3);
	ASSERT(ec2SeemsOn3(a, ec));
	ASSERT(ec2SeemsOn3(b, ec));
	ASSERT(wwIsSameOrDisjoint(a, c, 3 * n));
	ASSERT(wwIsSameOrDisjoint(b, c, 3 * n));
	// a == O => c <- b
	if (qrIsZero(ecZ(a, n), ec->f))
	{
		wwCopy(c, b, 3 * n);
		return;
	}
	// b == O => c <- a
	if (qrIsZero(ecZ(b, n), ec->f))
	{
		wwCopy(c, a, 3 * n);
		return;
	}
	// t1 <- xa zb [A]
	qrMul(t1, ecX(a), ecZ(b, n), ec->f, stack);
	// t2 <- xb za [B]
	qrMul(t2, ecX(b), ecZ(a, n), ec->f, stack);
	// t3 <- ya zb^2 [G]
	qrSqr(t3, ecZ(b, n), ec->f, stack);
	qrMul(t3, t3, ecY(a, n), ec->f, stack);
	// t4 <- yb za^2 [H]
	qrSqr(t4, ecZ(a, n), ec->f, stack);
	qrMul(t4, t4, ecY(b, n), ec->f, stack);
	// A == B => a == \pm b
	if (qrCmp(t1, t2, ec->f) == 0)
	{
		// t3 == t4 => a == b => c <- 2a
		if (qrCmp(t3, t4, ec->f) == 0)
			ec2DblLD(c, a, ec, stack);
		// t3 != t4 => a == -b => c <- O
		else
			qrSetZero(ecZ(c, n), ec->f);
		return;
	}
	// t5 <- t1 + t2 [E]
	gf2Add(t5, t1, t2, ec->f);
	// t6 <- t3 + t4 [I]
	gf2Add(t6, t3, t4, ec->f);
	// t5 <- t5 t6 [J]
	qrMul(t5, t5, t6, ec->f, stack);
	// xc <- t1^2 [C]
	qrSqr(ecX(c), t1, ec->f, stack);
	// yc <- t2^2 [D]
	qrSqr(ecY(c, n), t2, ec->f, stack);
	// t6 <- xc + yc [ec->f]
	gf2Add(t6, ecX(c), ecY(c, n), ec->f);
	// zc <- t6 za zb [ec->f * Z1 * Z2]
	qrMul(ecZ(c, n), ecZ(a, n), ecZ(b, n), ec->f, stack);
	qrMul(ecZ(c, n), t6, ecZ(c, n), ec->f, stack);
	// t4 <- t1 (t4 + yc) [A * (H + D)]
	gf2Add2(t4, ecY(c, n), ec->f);
	qrMul(t4, t1, t4, ec->f, stack);
	// xc <- t2 (xc + t3) + t4 [B * (C + G) + A * (H + D)]
	gf2Add2(ecX(c), t3, ec->f);
	qrMul(ecX(c), t2, ecX(c), ec->f, stack);
	gf2Add2(ecX(c), t4, ec->f);
	// t1 <- t1 t5 [A * J]
	qrMul(t1, t1, t5, ec->f, stack);
	// t3 <- t3 t6 [ec->f * G]
	qrMul(t3, t3, t6, ec->f, stack);
	// t1 <- (t1 + t3) t6 [(A * J + ec->f * G) * ec->f]
	gf2Add2(t1, t3, ec->f);
	qrMul(t1, t1, t6, ec->f, stack);
	// yc <- (t5 + zc) xc [(J + Z3) * X3]
	gf2Add(ecY(c, n), t5, ecZ(c, n), ec->f);
	qrMul(ecY(c, n), ecY(c, n), ecX(c), ec->f, stack);
	// yc <- yc + t1 [(A * J + ec->f * G) * ec->f + (J + Z3) * X3]
	gf2Add2(ecY(c, n), t1, ec->f);
}